

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeAtomic(TranslateToFuzzReader *this,Type type)

{
  Expression *pEVar1;
  Expression *ptr_00;
  uint uVar2;
  TranslateToFuzzReader *type_00;
  bool bVar3;
  int8_t iVar4;
  BasicType BVar5;
  Index IVar6;
  AtomicRMWOp op;
  reference pvVar7;
  pointer pMVar8;
  Expression *pEVar9;
  bool local_e9;
  Address local_c8;
  TranslateToFuzzReader *local_c0;
  Expression *local_b8;
  Expression *replacement;
  Expression *local_a8;
  Expression *expected;
  char *local_98;
  Type local_90;
  Address local_88;
  TranslateToFuzzReader *local_80;
  Expression *local_78;
  Expression *value;
  Expression *ptr;
  Index offset;
  Index bytes;
  char *local_58;
  Address local_50;
  Type local_48;
  Expression *local_40;
  Expression *count;
  Expression *ptr_1;
  TranslateToFuzzReader *local_28;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar3 = FeatureSet::hasAtomics((FeatureSet *)(this->wasm + 0x108));
  if (!bVar3) {
    __assert_fail("wasm.features.hasAtomics()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xb14,"Expression *wasm::TranslateToFuzzReader::makeAtomic(Type)");
  }
  if ((this->allowMemory & 1U) == 0) {
    local_28 = this_local;
    type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
  }
  else {
    pvVar7 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                           *)(this->wasm + 0x78),0);
    pMVar8 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar7);
    pMVar8->shared = true;
    ptr_1._4_4_ = 0;
    bVar3 = Type::operator==((Type *)&this_local,(BasicType *)((long)&ptr_1 + 4));
    if (bVar3) {
      type_local.id = (uintptr_t)Builder::makeAtomicFence(&this->builder);
    }
    else {
      ptr_1._0_4_ = 2;
      bVar3 = Type::operator==((Type *)&this_local,(BasicType *)&ptr_1);
      local_e9 = false;
      if (bVar3) {
        local_e9 = oneIn(this,2);
      }
      if (local_e9 == false) {
        BVar5 = Type::getBasic((Type *)&this_local);
        if (BVar5 == i32) {
          IVar6 = upTo(this,3);
          if (IVar6 == 0) {
            ptr._4_4_ = 1;
          }
          else if (IVar6 == 1) {
            ptr._4_4_ = pick<int,int>(this,1,2);
          }
          else {
            if (IVar6 != 2) {
              wasm::handle_unreachable
                        ("invalide value",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                         ,0xb3d);
            }
            ptr._4_4_ = pick<int,int,int>(this,1,2,4);
          }
        }
        else {
          if (BVar5 != i64) {
            wasm::handle_unreachable
                      ("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                       ,0xb55);
          }
          IVar6 = upTo(this,4);
          switch(IVar6) {
          case 0:
            ptr._4_4_ = 1;
            break;
          case 1:
            ptr._4_4_ = pick<int,int>(this,1,2);
            break;
          case 2:
            ptr._4_4_ = pick<int,int,int>(this,1,2,4);
            break;
          case 3:
            ptr._4_4_ = pick<int,int,int,int>(this,1,2,4,8);
            break;
          default:
            wasm::handle_unreachable
                      ("invalide value",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                       ,0xb50);
          }
        }
        iVar4 = get(this);
        ptr._0_4_ = logify(this,(int)iVar4);
        value = makePointer(this);
        bVar3 = oneIn(this,2);
        if (bVar3) {
          local_80 = this_local;
          local_78 = make(this,(Type)this_local);
          op = pick<wasm::AtomicRMWOp,wasm::AtomicRMWOp,wasm::AtomicRMWOp,wasm::AtomicRMWOp,wasm::AtomicRMWOp,wasm::AtomicRMWOp>
                         (this,RMWAdd,RMWSub,RMWAnd,RMWOr,RMWXor,RMWXchg);
          uVar2 = ptr._4_4_;
          Address::Address(&local_88,(ulong)(Index)ptr);
          pEVar9 = value;
          pEVar1 = local_78;
          local_90.id = (uintptr_t)this_local;
          pvVar7 = std::
                   vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                 *)(this->wasm + 0x78),0);
          pMVar8 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                             (pvVar7);
          expected = (Expression *)
                     (pMVar8->super_Importable).super_Named.name.super_IString.str._M_len;
          local_98 = (pMVar8->super_Importable).super_Named.name.super_IString.str._M_str;
          type_local.id =
               (uintptr_t)
               Builder::makeAtomicRMW
                         (&this->builder,op,uVar2,local_88,pEVar9,pEVar1,local_90,
                          (Name)(pMVar8->super_Importable).super_Named.name.super_IString.str);
        }
        else {
          replacement = (Expression *)this_local;
          local_a8 = make(this,(Type)this_local);
          local_c0 = this_local;
          local_b8 = make(this,(Type)this_local);
          uVar2 = ptr._4_4_;
          Address::Address(&local_c8,(ulong)(Index)ptr);
          type_00 = this_local;
          ptr_00 = value;
          pEVar9 = local_a8;
          pEVar1 = local_b8;
          pvVar7 = std::
                   vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                 *)(this->wasm + 0x78),0);
          pMVar8 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                             (pvVar7);
          type_local.id =
               (uintptr_t)
               Builder::makeAtomicCmpxchg
                         (&this->builder,uVar2,local_c8,ptr_00,pEVar9,pEVar1,(Type)type_00,
                          (Name)(pMVar8->super_Importable).super_Named.name.super_IString.str);
        }
      }
      else {
        count = makePointer(this);
        Type::Type(&local_48,i32);
        pEVar9 = make(this,local_48);
        pEVar1 = count;
        local_40 = pEVar9;
        iVar4 = get(this);
        IVar6 = logify(this,(int)iVar4);
        Address::Address(&local_50,(ulong)IVar6);
        pvVar7 = std::
                 vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                               *)(this->wasm + 0x78),0);
        pMVar8 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (pvVar7);
        _offset = (pMVar8->super_Importable).super_Named.name.super_IString.str._M_len;
        local_58 = (pMVar8->super_Importable).super_Named.name.super_IString.str._M_str;
        type_local.id =
             (uintptr_t)
             Builder::makeAtomicNotify
                       (&this->builder,pEVar1,pEVar9,local_50,
                        (Name)(pMVar8->super_Importable).super_Named.name.super_IString.str);
      }
    }
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeAtomic(Type type) {
  assert(wasm.features.hasAtomics());
  if (!allowMemory) {
    return makeTrivial(type);
  }
  wasm.memories[0]->shared = true;
  if (type == Type::none) {
    return builder.makeAtomicFence();
  }
  if (type == Type::i32 && oneIn(2)) {
    if (ATOMIC_WAITS && oneIn(2)) {
      auto* ptr = makePointer();
      auto expectedType = pick(Type::i32, Type::i64);
      auto* expected = make(expectedType);
      auto* timeout = make(Type::i64);
      return builder.makeAtomicWait(ptr,
                                    expected,
                                    timeout,
                                    expectedType,
                                    logify(get()),
                                    wasm.memories[0]->name);
    } else {
      auto* ptr = makePointer();
      auto* count = make(Type::i32);
      return builder.makeAtomicNotify(
        ptr, count, logify(get()), wasm.memories[0]->name);
    }
  }
  Index bytes;
  switch (type.getBasic()) {
    case Type::i32: {
      switch (upTo(3)) {
        case 0:
          bytes = 1;
          break;
        case 1:
          bytes = pick(1, 2);
          break;
        case 2:
          bytes = pick(1, 2, 4);
          break;
        default:
          WASM_UNREACHABLE("invalide value");
      }
      break;
    }
    case Type::i64: {
      switch (upTo(4)) {
        case 0:
          bytes = 1;
          break;
        case 1:
          bytes = pick(1, 2);
          break;
        case 2:
          bytes = pick(1, 2, 4);
          break;
        case 3:
          bytes = pick(1, 2, 4, 8);
          break;
        default:
          WASM_UNREACHABLE("invalide value");
      }
      break;
    }
    default:
      WASM_UNREACHABLE("unexpected type");
  }
  auto offset = logify(get());
  auto* ptr = makePointer();
  if (oneIn(2)) {
    auto* value = make(type);
    return builder.makeAtomicRMW(
      pick(RMWAdd, RMWSub, RMWAnd, RMWOr, RMWXor, RMWXchg),
      bytes,
      offset,
      ptr,
      value,
      type,
      wasm.memories[0]->name);
  } else {
    auto* expected = make(type);
    auto* replacement = make(type);
    return builder.makeAtomicCmpxchg(
      bytes, offset, ptr, expected, replacement, type, wasm.memories[0]->name);
  }
}